

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void iterator_suite::test_const_iterator_constructible(void)

{
  bool bVar1;
  const_iterator bravo;
  array<int,_4UL> array;
  iterator local_68;
  iterator local_58;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bravo = (const_iterator)vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&local_58,&bravo);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29c,"void iterator_suite::test_const_iterator_constructible()",bVar1);
  bravo.parent = local_58.parent;
  bravo.current = local_58.current;
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&bravo,(iterator_type *)&local_68);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29e,"void iterator_suite::test_const_iterator_constructible()",bVar1);
  return;
}

Assistant:

void test_const_iterator_constructible()
{
    // Also checks implicit conversion from iterator to const_iterator
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::const_iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::const_iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}